

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Iterator.h
# Opt level: O1

Slice __thiscall arangodb::velocypack::ObjectIterator::value(ObjectIterator *this)

{
  byte *start;
  uint8_t *puVar1;
  ulong uVar2;
  Slice SVar3;
  Slice key;
  byte *pbStack_30;
  byte *local_10;
  
  if (this->_position == this->_size) {
    value();
    SVar3._start = (uint8_t *)this->_position;
    if (SVar3._start != (uint8_t *)this->_size) {
      SVar3._start = SVar3._start + 1;
      this->_position = (ValueLength)SVar3._start;
      pbStack_30 = this->_current;
      if (pbStack_30 != (byte *)0x0) {
        uVar2 = (ulong)"\x01\x01"[*pbStack_30];
        if (uVar2 == 0) {
          uVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&pbStack_30,pbStack_30);
        }
        puVar1 = this->_current;
        pbStack_30 = puVar1 + uVar2;
        this->_current = pbStack_30;
        SVar3._start = (uint8_t *)(ulong)"\x01\x01"[puVar1[uVar2]];
        if (SVar3._start == (uint8_t *)0x0) {
          SVar3._start = (uint8_t *)
                         SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                         byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                          *)&pbStack_30,pbStack_30);
        }
        this->_current = this->_current + SVar3._start;
      }
    }
    return (Slice)SVar3._start;
  }
  start = this->_current;
  if (start != (byte *)0x0) {
    uVar2 = (ulong)"\x01\x01"[*start];
    if (uVar2 == 0) {
      local_10 = start;
      uVar2 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::byteSizeDynamic
                        ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         &local_10,start);
    }
    return (Slice)(start + uVar2);
  }
  SVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getNthValue
                    ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)this,
                     this->_position);
  return (Slice)SVar3._start;
}

Assistant:

[[nodiscard]] Slice key(bool translate = true) const {
    if (VELOCYPACK_UNLIKELY(!valid())) {
      throw Exception{Exception::IndexOutOfBounds};
    }
    if (_current != nullptr) {
      Slice s{_current};
      return translate ? s.makeKey() : s;
    }
    return _slice.getNthKey(_position, translate);
  }